

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func_lib.hpp
# Opt level: O0

void __thiscall
deci::binop_t<deci::or_xclass_t>::Evaluate
          (binop_t<deci::or_xclass_t> *this,vm_t *param_1,stack_t *stack,stack_t *local)

{
  number_t *this_00;
  value_t *pvVar1;
  double dVar2;
  double b_00;
  number_t local_50;
  number_t *local_38;
  number_t *b;
  number_t *a;
  stack_t *local_local;
  stack_t *stack_local;
  vm_t *param_1_local;
  binop_t<deci::or_xclass_t> *this_local;
  
  a = (number_t *)local;
  local_local = stack;
  stack_local = &param_1->dataStack;
  param_1_local = (vm_t *)this;
  pvVar1 = stack_t::Top(stack,1);
  b = (number_t *)__dynamic_cast(pvVar1,&value_t::typeinfo,&number_t::typeinfo,0);
  if (b == (number_t *)0x0) {
    __cxa_bad_cast();
  }
  pvVar1 = stack_t::Top(local_local,0);
  local_38 = (number_t *)__dynamic_cast(pvVar1,&value_t::typeinfo,&number_t::typeinfo,0);
  this_00 = a;
  if (local_38 == (number_t *)0x0) {
    __cxa_bad_cast();
  }
  dVar2 = number_t::Value(b);
  b_00 = number_t::Value(local_38);
  dVar2 = or_xclass_t::Execute(dVar2,b_00);
  number_t::number_t(&local_50,dVar2);
  stack_t::Result((stack_t *)this_00,&local_50.super_value_t);
  number_t::~number_t(&local_50);
  return;
}

Assistant:

void Evaluate(vm_t&, const stack_t& stack, stack_t& local) override {
      number_t& a = dynamic_cast<number_t&>(stack.Top(1));
      number_t& b = dynamic_cast<number_t&>(stack.Top(0));
      local.Result(number_t(xclass::Execute(a.Value(), b.Value())));
    }